

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBegin_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params *params,
                 U64 pledgedSrcSize,ZSTD_buffered_policy_e zbuff)

{
  ZSTD_compressionParameters *pZVar1;
  ZSTD_dictAttachPref_e ZVar2;
  U32 UVar3;
  void *pvVar4;
  void *pvVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  ZSTD_strategy ZVar16;
  BYTE *pBVar17;
  BYTE *pBVar18;
  ZSTD_compressionParameters cPar;
  ZSTD_CCtx_params params_00;
  ZSTD_CCtx_params params_01;
  ZSTD_CCtx_params params_02;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  U32 UVar22;
  U32 end;
  uint uVar23;
  size_t sVar24;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  undefined8 *puVar28;
  undefined8 *puVar29;
  ZSTD_matchState_t *srcMatchState;
  size_t sVar30;
  ZSTD_matchState_t *dstMatchState;
  byte bVar31;
  undefined8 in_stack_fffffffffffffe88;
  undefined8 uVar32;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 uVar33;
  undefined4 in_stack_fffffffffffffea4;
  undefined1 auVar34 [12];
  undefined1 auVar35 [24];
  undefined1 in_stack_fffffffffffffea8 [112];
  undefined1 auVar36 [24];
  undefined4 local_dc;
  undefined4 uStack_d8;
  undefined1 local_c0 [8];
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined8 uStack_a8;
  
  bVar31 = 0;
  auVar6._0_4_ = (params->cParams).windowLog;
  auVar6._4_4_ = (params->cParams).chainLog;
  auVar6._8_4_ = (params->cParams).hashLog;
  auVar6._12_4_ = (params->cParams).searchLog;
  auVar6 = vpaddd_avx(auVar6,_DAT_001b5ab0);
  auVar7 = vpminud_avx(auVar6,_DAT_001b5ac0);
  auVar6 = vpcmpeqd_avx(auVar6,auVar7);
  if (((((((auVar6 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
          (auVar6 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar6 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar6[0xf] < '\0')
       || (4 < (params->cParams).minMatch - 3)) || (0x20000 < (params->cParams).targetLength)) ||
     (8 < (params->cParams).strategy - ZSTD_fast)) {
    __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params->cParams))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3637,
                  "size_t ZSTD_compressBegin_internal(ZSTD_CCtx *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, const ZSTD_CDict *, const ZSTD_CCtx_params *, U64, ZSTD_buffered_policy_e)"
                 );
  }
  if (cdict != (ZSTD_CDict *)0x0 && dict != (void *)0x0) {
    __assert_fail("!((dict) && (cdict))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3638,
                  "size_t ZSTD_compressBegin_internal(ZSTD_CCtx *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, const ZSTD_CDict *, const ZSTD_CCtx_params *, U64, ZSTD_buffered_policy_e)"
                 );
  }
  if ((((cdict == (ZSTD_CDict *)0x0) || (cdict->dictContentSize == 0)) ||
      (((0x1ffff < pledgedSrcSize &&
        ((pledgedSrcSize != 0xffffffffffffffff && (cdict->dictContentSize * 6 <= pledgedSrcSize))))
       && (cdict->compressionLevel != 0)))) ||
     (ZVar2 = params->attachDictPref, ZVar2 == ZSTD_dictForceLoad)) {
    puVar28 = (undefined8 *)&stack0xfffffffffffffe88;
    for (lVar27 = 0x12; lVar27 != 0; lVar27 = lVar27 + -1) {
      *puVar28 = *(undefined8 *)params;
      params = (ZSTD_CCtx_params *)&(params->cParams).chainLog;
      puVar28 = puVar28 + 1;
    }
    params_00.cParams.chainLog = in_stack_fffffffffffffe90;
    params_00.format = (int)in_stack_fffffffffffffe88;
    params_00.cParams.windowLog = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
    params_00.cParams.hashLog = in_stack_fffffffffffffe94;
    params_00.cParams.searchLog = in_stack_fffffffffffffe98;
    params_00.cParams.minMatch = in_stack_fffffffffffffe9c;
    params_00.cParams.targetLength = in_stack_fffffffffffffea0;
    params_00.cParams.strategy = in_stack_fffffffffffffea4;
    auVar34 = in_stack_fffffffffffffea8._0_12_;
    auVar35 = in_stack_fffffffffffffea8._64_24_;
    auVar36 = in_stack_fffffffffffffea8._88_24_;
    params_00.fParams.contentSizeFlag = auVar34._0_4_;
    params_00.fParams.checksumFlag = auVar34._4_4_;
    params_00.fParams.noDictIDFlag = auVar34._8_4_;
    params_00.compressionLevel = in_stack_fffffffffffffea8._12_4_;
    params_00.forceWindow = in_stack_fffffffffffffea8._16_4_;
    params_00._52_4_ = in_stack_fffffffffffffea8._20_4_;
    params_00.targetCBlockSize = in_stack_fffffffffffffea8._24_8_;
    params_00.srcSizeHint = in_stack_fffffffffffffea8._32_4_;
    params_00.attachDictPref = in_stack_fffffffffffffea8._36_4_;
    params_00.literalCompressionMode = in_stack_fffffffffffffea8._40_4_;
    params_00.nbWorkers = in_stack_fffffffffffffea8._44_4_;
    params_00.jobSize = in_stack_fffffffffffffea8._48_8_;
    params_00.overlapLog = in_stack_fffffffffffffea8._56_4_;
    params_00.rsyncable = in_stack_fffffffffffffea8._60_4_;
    params_00.ldmParams.enableLdm = auVar35._0_4_;
    params_00.ldmParams.hashLog = auVar35._4_4_;
    params_00.ldmParams.bucketSizeLog = auVar35._8_4_;
    params_00.ldmParams.minMatchLength = auVar35._12_4_;
    params_00.ldmParams.hashRateLog = auVar35._16_4_;
    params_00.ldmParams.windowLog = auVar35._20_4_;
    params_00.customMem.customAlloc = (ZSTD_allocFunction)auVar36._0_8_;
    params_00.customMem.customFree = (ZSTD_freeFunction)auVar36._8_8_;
    params_00.customMem.opaque = (void *)auVar36._16_8_;
    sVar24 = ZSTD_resetCCtx_internal(cctx,params_00,pledgedSrcSize,ZSTDcrp_makeClean,zbuff);
    if (sVar24 < 0xffffffffffffff89) {
      if (cdict == (ZSTD_CDict *)0x0) {
        uVar33 = SUB84(cctx->entropyWorkspace,0);
        uVar12 = (undefined4)((ulong)cctx->entropyWorkspace >> 0x20);
      }
      else {
        dict = cdict->dictContent;
        dictSize = cdict->dictContentSize;
        uVar33 = SUB84(cctx->entropyWorkspace,0);
        uVar12 = (undefined4)((ulong)cctx->entropyWorkspace >> 0x20);
      }
      sVar24 = ZSTD_compress_insertDictionary
                         ((cctx->blockState).prevCBlock,&(cctx->blockState).matchState,
                          &cctx->ldmState,&cctx->workspace,&cctx->appliedParams,dict,dictSize,
                          dictContentType,dtlm,(void *)CONCAT44(uVar12,uVar33));
      if (sVar24 < 0xffffffffffffff89) {
        if (sVar24 >> 0x20 == 0) {
          cctx->dictID = (U32)sVar24;
          return 0;
        }
        __assert_fail("dictID <= UINT_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3650,
                      "size_t ZSTD_compressBegin_internal(ZSTD_CCtx *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, const ZSTD_CDict *, const ZSTD_CCtx_params *, U64, ZSTD_buffered_policy_e)"
                     );
      }
      return sVar24;
    }
    return sVar24;
  }
  if ((pledgedSrcSize == 0xffffffffffffffff) ||
     (pledgedSrcSize <= attachDictSizeCutoffs[(cdict->matchState).cParams.strategy])) {
    if (ZVar2 != ZSTD_dictForceCopy) goto LAB_00153be4;
  }
  else if (ZVar2 == ZSTD_dictForceAttach) {
LAB_00153be4:
    if (params->forceWindow == 0) {
      memcpy(local_c0,params,0x90);
      uVar33 = local_c0._4_4_;
      if (local_c0._4_4_ == 0) {
        __assert_fail("windowLog != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3099,
                      "size_t ZSTD_resetCCtx_byAttachingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                     );
      }
      pZVar1 = &(cdict->matchState).cParams;
      uVar32._0_4_ = pZVar1->windowLog;
      uVar32._4_4_ = pZVar1->chainLog;
      uVar12 = (cdict->matchState).cParams.hashLog;
      uVar13 = (cdict->matchState).cParams.searchLog;
      uVar19 = pZVar1->windowLog;
      uVar20 = pZVar1->chainLog;
      uVar21 = pZVar1->hashLog;
      cPar.hashLog = uVar21;
      cPar.chainLog = uVar20;
      cPar.windowLog = uVar19;
      uVar14 = (cdict->matchState).cParams.minMatch;
      uVar15 = (cdict->matchState).cParams.targetLength;
      ZVar16 = (cdict->matchState).cParams.strategy;
      cPar.searchLog = uVar13;
      cPar.minMatch = uVar14;
      cPar.targetLength = uVar15;
      cPar.strategy = ZVar16;
      ZSTD_adjustCParams_internal
                ((ZSTD_compressionParameters *)(local_c0 + 4),cPar,pledgedSrcSize,0);
      stack0xffffffffffffff44 = CONCAT44(uStack_b8,uVar33);
      puVar28 = (undefined8 *)local_c0;
      puVar29 = (undefined8 *)&stack0xfffffffffffffe88;
      for (lVar27 = 0x12; lVar27 != 0; lVar27 = lVar27 + -1) {
        *puVar29 = *puVar28;
        puVar28 = puVar28 + (ulong)bVar31 * -2 + 1;
        puVar29 = puVar29 + (ulong)bVar31 * -2 + 1;
      }
      params_02.cParams.chainLog = uVar12;
      params_02.format = (int)uVar32;
      params_02.cParams.windowLog = (int)((ulong)uVar32 >> 0x20);
      params_02.cParams.hashLog = uVar13;
      params_02.cParams.searchLog = uVar14;
      params_02.cParams.minMatch = uVar15;
      params_02.cParams.targetLength = ZVar16;
      params_02.cParams.strategy = in_stack_fffffffffffffea4;
      auVar34 = in_stack_fffffffffffffea8._0_12_;
      auVar35 = in_stack_fffffffffffffea8._64_24_;
      auVar36 = in_stack_fffffffffffffea8._88_24_;
      params_02.fParams.contentSizeFlag = auVar34._0_4_;
      params_02.fParams.checksumFlag = auVar34._4_4_;
      params_02.fParams.noDictIDFlag = auVar34._8_4_;
      params_02.compressionLevel = in_stack_fffffffffffffea8._12_4_;
      params_02.forceWindow = in_stack_fffffffffffffea8._16_4_;
      params_02._52_4_ = in_stack_fffffffffffffea8._20_4_;
      params_02.targetCBlockSize = in_stack_fffffffffffffea8._24_8_;
      params_02.srcSizeHint = in_stack_fffffffffffffea8._32_4_;
      params_02.attachDictPref = in_stack_fffffffffffffea8._36_4_;
      params_02.literalCompressionMode = in_stack_fffffffffffffea8._40_4_;
      params_02.nbWorkers = in_stack_fffffffffffffea8._44_4_;
      params_02.jobSize = in_stack_fffffffffffffea8._48_8_;
      params_02.overlapLog = in_stack_fffffffffffffea8._56_4_;
      params_02.rsyncable = in_stack_fffffffffffffea8._60_4_;
      params_02.ldmParams.enableLdm = auVar35._0_4_;
      params_02.ldmParams.hashLog = auVar35._4_4_;
      params_02.ldmParams.bucketSizeLog = auVar35._8_4_;
      params_02.ldmParams.minMatchLength = auVar35._12_4_;
      params_02.ldmParams.hashRateLog = auVar35._16_4_;
      params_02.ldmParams.windowLog = auVar35._20_4_;
      params_02.customMem.customAlloc = (ZSTD_allocFunction)auVar36._0_8_;
      params_02.customMem.customFree = (ZSTD_freeFunction)auVar36._8_8_;
      params_02.customMem.opaque = (void *)auVar36._16_8_;
      sVar24 = ZSTD_resetCCtx_internal(cctx,params_02,pledgedSrcSize,ZSTDcrp_makeClean,zbuff);
      if (0xffffffffffffff88 < sVar24) {
        return sVar24;
      }
      if ((cctx->appliedParams).cParams.strategy != (cdict->matchState).cParams.strategy) {
        __assert_fail("cctx->appliedParams.cParams.strategy == cdict_cParams->strategy",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x30a1,
                      "size_t ZSTD_resetCCtx_byAttachingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                     );
      }
      uVar25 = (long)(cdict->matchState).window.nextSrc - (long)(cdict->matchState).window.base;
      uVar23 = (uint)uVar25;
      if ((cdict->matchState).window.dictLimit != uVar23) {
        (cctx->blockState).matchState.dictMatchState = &cdict->matchState;
        uVar26 = (cctx->blockState).matchState.window.dictLimit;
        if (uVar26 < uVar23) {
          (cctx->blockState).matchState.window.nextSrc =
               (cctx->blockState).matchState.window.base + (uVar25 & 0xffffffff);
          (cctx->blockState).matchState.window.lowLimit = uVar23;
          (cctx->blockState).matchState.window.dictLimit = uVar23;
          uVar26 = uVar23;
        }
        (cctx->blockState).matchState.loadedDictEnd = uVar26;
      }
      goto LAB_00153dc0;
    }
  }
  memcpy(local_c0,params,0x90);
  if (local_c0._4_4_ == 0) {
    __assert_fail("windowLog != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x30cc,
                  "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                 );
  }
  uVar8 = (cdict->matchState).cParams.chainLog;
  uVar9 = (cdict->matchState).cParams.hashLog;
  uVar10 = (cdict->matchState).cParams.searchLog;
  uVar11 = (cdict->matchState).cParams.minMatch;
  uStack_ac = uVar11;
  uStack_a8._0_4_ = (cdict->matchState).cParams.targetLength;
  uStack_a8._4_4_ = (cdict->matchState).cParams.strategy;
  uStack_b4 = uVar9;
  uStack_b0 = uVar10;
  stack0xffffffffffffff44 = CONCAT44(uVar8,local_c0._4_4_);
  puVar28 = (undefined8 *)local_c0;
  puVar29 = (undefined8 *)&stack0xfffffffffffffe88;
  for (lVar27 = 0x12; lVar27 != 0; lVar27 = lVar27 + -1) {
    *puVar29 = *puVar28;
    puVar28 = puVar28 + (ulong)bVar31 * -2 + 1;
    puVar29 = puVar29 + (ulong)bVar31 * -2 + 1;
  }
  params_01.cParams.chainLog = in_stack_fffffffffffffe90;
  params_01.format = (int)in_stack_fffffffffffffe88;
  params_01.cParams.windowLog = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  params_01.cParams.hashLog = in_stack_fffffffffffffe94;
  params_01.cParams.searchLog = in_stack_fffffffffffffe98;
  params_01.cParams.minMatch = in_stack_fffffffffffffe9c;
  params_01.cParams.targetLength = in_stack_fffffffffffffea0;
  params_01.cParams.strategy = in_stack_fffffffffffffea4;
  auVar34 = in_stack_fffffffffffffea8._0_12_;
  auVar35 = in_stack_fffffffffffffea8._64_24_;
  auVar36 = in_stack_fffffffffffffea8._88_24_;
  params_01.fParams.contentSizeFlag = auVar34._0_4_;
  params_01.fParams.checksumFlag = auVar34._4_4_;
  params_01.fParams.noDictIDFlag = auVar34._8_4_;
  params_01.compressionLevel = in_stack_fffffffffffffea8._12_4_;
  params_01.forceWindow = in_stack_fffffffffffffea8._16_4_;
  params_01._52_4_ = in_stack_fffffffffffffea8._20_4_;
  params_01.targetCBlockSize = in_stack_fffffffffffffea8._24_8_;
  params_01.srcSizeHint = in_stack_fffffffffffffea8._32_4_;
  params_01.attachDictPref = in_stack_fffffffffffffea8._36_4_;
  params_01.literalCompressionMode = in_stack_fffffffffffffea8._40_4_;
  params_01.nbWorkers = in_stack_fffffffffffffea8._44_4_;
  params_01.jobSize = in_stack_fffffffffffffea8._48_8_;
  params_01.overlapLog = in_stack_fffffffffffffea8._56_4_;
  params_01.rsyncable = in_stack_fffffffffffffea8._60_4_;
  params_01.ldmParams.enableLdm = auVar35._0_4_;
  params_01.ldmParams.hashLog = auVar35._4_4_;
  params_01.ldmParams.bucketSizeLog = auVar35._8_4_;
  params_01.ldmParams.minMatchLength = auVar35._12_4_;
  params_01.ldmParams.hashRateLog = auVar35._16_4_;
  params_01.ldmParams.windowLog = auVar35._20_4_;
  params_01.customMem.customAlloc = (ZSTD_allocFunction)auVar36._0_8_;
  params_01.customMem.customFree = (ZSTD_freeFunction)auVar36._8_8_;
  params_01.customMem.opaque = (void *)auVar36._16_8_;
  sVar24 = ZSTD_resetCCtx_internal(cctx,params_01,pledgedSrcSize,ZSTDcrp_leaveDirty,zbuff);
  if (0xffffffffffffff88 < sVar24) {
    return sVar24;
  }
  if ((cctx->appliedParams).cParams.strategy != (cdict->matchState).cParams.strategy) {
    __assert_fail("cctx->appliedParams.cParams.strategy == cdict_cParams->strategy",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x30d2,
                  "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                 );
  }
  if ((cctx->appliedParams).cParams.hashLog != (cdict->matchState).cParams.hashLog) {
    __assert_fail("cctx->appliedParams.cParams.hashLog == cdict_cParams->hashLog",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x30d3,
                  "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                 );
  }
  if ((cctx->appliedParams).cParams.chainLog != (cdict->matchState).cParams.chainLog) {
    __assert_fail("cctx->appliedParams.cParams.chainLog == cdict_cParams->chainLog",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x30d4,
                  "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                 );
  }
  pvVar4 = (cctx->workspace).objectEnd;
  pvVar5 = (cctx->workspace).tableValidEnd;
  if (pvVar5 < pvVar4) {
    __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x1d55,"void ZSTD_cwksp_mark_tables_dirty(ZSTD_cwksp *)");
  }
  if ((cctx->workspace).allocStart < pvVar5) {
    __assert_fail("ws->tableValidEnd <= ws->allocStart",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x1d56,"void ZSTD_cwksp_mark_tables_dirty(ZSTD_cwksp *)");
  }
  (cctx->workspace).tableValidEnd = pvVar4;
  ZSTD_cwksp_assert_internal_consistency(&cctx->workspace);
  if ((cdict->matchState).cParams.strategy == ZSTD_fast) {
    sVar30 = 0;
  }
  else {
    sVar30 = 4L << ((byte)(cdict->matchState).cParams.chainLog & 0x3f);
  }
  memcpy((cctx->blockState).matchState.hashTable,(cdict->matchState).hashTable,
         4L << ((byte)(cdict->matchState).cParams.hashLog & 0x3f));
  memcpy((cctx->blockState).matchState.chainTable,(cdict->matchState).chainTable,sVar30);
  if ((cdict->matchState).hashLog3 != 0) {
    __assert_fail("cdict->matchState.hashLog3 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x30e8,
                  "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                 );
  }
  UVar3 = (cctx->blockState).matchState.hashLog3;
  sVar30 = 0;
  if (UVar3 != 0) {
    sVar30 = 4L << ((byte)UVar3 & 0x3f);
  }
  memset((cctx->blockState).matchState.hashTable3,0,sVar30);
  pvVar4 = (cctx->workspace).tableValidEnd;
  if (pvVar4 < (cctx->workspace).objectEnd) {
    __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x1d5d,"void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *)");
  }
  if ((cctx->workspace).allocStart < pvVar4) {
    __assert_fail("ws->tableValidEnd <= ws->allocStart",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x1d5e,"void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *)");
  }
  pvVar5 = (cctx->workspace).tableEnd;
  if (pvVar4 < pvVar5) {
    (cctx->workspace).tableValidEnd = pvVar5;
  }
  ZSTD_cwksp_assert_internal_consistency(&cctx->workspace);
  pBVar17 = (cdict->matchState).window.base;
  pBVar18 = (cdict->matchState).window.dictBase;
  UVar3 = (cdict->matchState).window.dictLimit;
  UVar22 = (cdict->matchState).window.lowLimit;
  (cctx->blockState).matchState.window.nextSrc = (cdict->matchState).window.nextSrc;
  (cctx->blockState).matchState.window.base = pBVar17;
  (cctx->blockState).matchState.window.dictBase = pBVar18;
  (cctx->blockState).matchState.window.dictLimit = UVar3;
  (cctx->blockState).matchState.window.lowLimit = UVar22;
  UVar3 = (cdict->matchState).nextToUpdate;
  (cctx->blockState).matchState.loadedDictEnd = (cdict->matchState).loadedDictEnd;
  (cctx->blockState).matchState.nextToUpdate = UVar3;
LAB_00153dc0:
  cctx->dictID = cdict->dictID;
  memcpy((cctx->blockState).prevCBlock,&cdict->cBlockState,0x11f0);
  return 0;
}

Assistant:

static size_t ZSTD_compressBegin_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    const ZSTD_CCtx_params* params, U64 pledgedSrcSize,
                                    ZSTD_buffered_policy_e zbuff)
{
    DEBUGLOG(4, "ZSTD_compressBegin_internal: wlog=%u", params->cParams.windowLog);
    /* params are supposed to be fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */
    if ( (cdict)
      && (cdict->dictContentSize > 0)
      && ( pledgedSrcSize < ZSTD_USE_CDICT_PARAMS_SRCSIZE_CUTOFF
        || pledgedSrcSize < cdict->dictContentSize * ZSTD_USE_CDICT_PARAMS_DICTSIZE_MULTIPLIER
        || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
        || cdict->compressionLevel == 0)
      && (params->attachDictPref != ZSTD_dictForceLoad) ) {
        return ZSTD_resetCCtx_usingCDict(cctx, cdict, params, pledgedSrcSize, zbuff);
    }

    FORWARD_IF_ERROR( ZSTD_resetCCtx_internal(cctx, *params, pledgedSrcSize,
                                     ZSTDcrp_makeClean, zbuff) );
    {   size_t const dictID = cdict ?
                ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, cdict->dictContent,
                        cdict->dictContentSize, dictContentType, dtlm,
                        cctx->entropyWorkspace)
              : ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, dict, dictSize,
                        dictContentType, dtlm, cctx->entropyWorkspace);
        FORWARD_IF_ERROR(dictID);
        assert(dictID <= UINT_MAX);
        cctx->dictID = (U32)dictID;
    }
    return 0;
}